

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_writer.cpp
# Opt level: O0

void __thiscall dpfb::FontWriter::FontWriter(FontWriter *this,char *name,char *fileExtension)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  FontWriter *pFVar3;
  char *__s2;
  bool bVar4;
  long *local_28;
  FontWriter **pos;
  char *fileExtension_local;
  char *name_local;
  FontWriter *this_local;
  
  this->_vptr_FontWriter = (_func_int **)&PTR__FontWriter_00166a38;
  this->name = name;
  this->fileExtension = fileExtension;
  pcVar2 = getName(this);
  pFVar3 = find(pcVar2);
  __stream = _stderr;
  if (pFVar3 != (FontWriter *)0x0) {
    pcVar2 = getName(this);
    fprintf(__stream,"FontWriter \"%s\" is already registered\n",pcVar2);
    exit(1);
  }
  local_28 = &list;
  while( true ) {
    bVar4 = false;
    if (*local_28 != 0) {
      pcVar2 = *(char **)(*local_28 + 8);
      __s2 = getName(this);
      iVar1 = strcmp(pcVar2,__s2);
      bVar4 = iVar1 < 0;
    }
    if (!bVar4) break;
    local_28 = (long *)(*local_28 + 0x18);
  }
  this->next = (FontWriter *)*local_28;
  *local_28 = (long)this;
  return;
}

Assistant:

FontWriter::FontWriter(const char* name, const char* fileExtension)
    : name {name}
    , fileExtension {fileExtension}
{
    LINK_PLUGIN(FontWriter);
}